

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,void **vtt,int64_t rows,int64_t columns)

{
  complex<float> *__s;
  ulong uVar1;
  
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (&this->super_TPZMatrix<std::complex<float>_>,vtt + 1,rows,columns);
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  this->fElem = (complex<float> *)0x0;
  this->fGiven = (complex<float> *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01650620;
  (this->fWork).fNAlloc = 0;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  uVar1 = columns * rows;
  if (uVar1 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    memset(__s,0,uVar1 * 8);
    this->fElem = __s;
  }
  return;
}

Assistant:

explicit inline  TPZFMatrix(const int64_t rows ,const int64_t columns = 1) : 
    TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>(rows,columns), fElem(0),fGiven(0),fSize(0) {
        if(rows*columns) fElem = new TVar[rows*columns];
    }